

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

void AnalyzeFunctionDefinitionArguments
               (ExpressionContext *ctx,IntrusiveList<SynFunctionArgument> arguments,
               TypeBase *parentType,TypeFunction *instance,SmallArray<ArgumentData,_8U> *argData)

{
  bool bVar1;
  uint uVar2;
  SynIdentifier *pSVar3;
  ArgumentData *pAVar4;
  ExpressionContext *pEVar5;
  int iVar6;
  TypeHandle *in_RAX;
  ExprBase *pEVar7;
  undefined4 extraout_var;
  TypeBase *pTVar8;
  bool *failed_00;
  char *msg;
  ulong uVar9;
  SynFunctionArgument *source;
  SynBase *source_00;
  SynFunctionArgument *source_01;
  bool failed;
  uint local_6c;
  SynFunctionArgument *local_68;
  ExprBase *local_60;
  TypeHandle *local_58;
  ExpressionContext *local_50;
  TypeFunction *local_48;
  SmallArray<ArgumentData,_8U> *local_40;
  SynFunctionArgument *local_38;
  
  source = arguments.head;
  if (instance == (TypeFunction *)0x0) {
    local_58 = (TypeHandle *)0x0;
  }
  else {
    in_RAX = (instance->arguments).head;
    local_58 = in_RAX;
  }
  local_40 = argData;
  local_68 = source;
  if (parentType == (TypeBase *)0x0) {
    local_6c = 0;
  }
  else {
    local_6c = (uint)CONCAT71((int7)((ulong)in_RAX >> 8),parentType->isGeneric);
  }
  do {
    if (source == (SynFunctionArgument *)0x0) {
      return;
    }
    local_50 = ctx;
    local_48 = instance;
    if (source->initializer == (SynBase *)0x0) {
      pEVar7 = (ExprBase *)0x0;
    }
    else {
      pEVar7 = AnalyzeExpression(ctx,source->initializer);
    }
    if (instance == (TypeFunction *)0x0) {
      local_60 = pEVar7;
      ExpressionContext::PushTemporaryScope(ctx);
      if (source != local_68) {
        uVar9 = 0;
        source_01 = local_68;
        local_38 = source;
        do {
          pEVar5 = local_50;
          if (argData->count <= (uint)uVar9) {
            __assert_fail("index < count",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                          ,0x199,
                          "T &SmallArray<ArgumentData, 8>::operator[](unsigned int) [T = ArgumentData, N = 8]"
                         );
          }
          pAVar4 = argData->data;
          iVar6 = (*local_50->allocator->_vptr_Allocator[2])(local_50->allocator,0x170);
          pSVar3 = pAVar4[uVar9].name;
          pTVar8 = pAVar4[uVar9].type;
          uVar2 = pEVar5->uniqueVariableId;
          pEVar5->uniqueVariableId = uVar2 + 1;
          VariableData::VariableData
                    ((VariableData *)CONCAT44(extraout_var,iVar6),pEVar5->allocator,
                     &source_01->super_SynBase,pEVar5->scope,0,pTVar8,pSVar3,0,uVar2);
          ExpressionContext::AddVariable(pEVar5,(VariableData *)CONCAT44(extraout_var,iVar6),true);
          source_01 = (SynFunctionArgument *)(source_01->super_SynBase).next;
          if ((source_01 == (SynFunctionArgument *)0x0) ||
             ((source_01->super_SynBase).typeID != 0x36)) {
            source_01 = (SynFunctionArgument *)0x0;
          }
          source = local_38;
          argData = local_40;
        } while ((source_01 != (SynFunctionArgument *)0x0) &&
                (uVar9 = (ulong)((uint)uVar9 + 1), source_01 != local_38));
      }
      pEVar5 = local_50;
      failed = false;
      failed_00 = (bool *)0x0;
      if ((local_6c & 1) != 0) {
        failed_00 = &failed;
      }
      pTVar8 = AnalyzeType(local_50,source->type,true,failed_00);
      if (pTVar8 == pEVar5->typeAuto) {
        if (local_60 == (ExprBase *)0x0) {
          source_00 = source->type;
          msg = "ERROR: function argument cannot be an auto type";
          goto LAB_001ffbeb;
        }
        pEVar7 = ResolveInitializerValue(pEVar5,&source->super_SynBase,local_60);
        pTVar8 = pEVar7->type;
      }
      else if (local_60 == (ExprBase *)0x0) {
        pEVar7 = (ExprBase *)0x0;
      }
      else {
        pEVar7 = local_60;
        if ((((local_60->type == (TypeBase *)0x0) || (local_60->type->typeID != 0)) &&
            (pTVar8->isGeneric == false)) && ((pTVar8 == (TypeBase *)0x0 || (pTVar8->typeID != 0))))
        {
          CreateCast(pEVar5,source->type,local_60,pTVar8,true);
          pEVar7 = local_60;
        }
      }
      if (pTVar8 == pEVar5->typeVoid) {
        source_00 = source->type;
        msg = "ERROR: function argument cannot be a void type";
LAB_001ffbeb:
        anon_unknown.dwarf_11255e::Stop(pEVar5,source_00,msg);
      }
      local_6c = CONCAT31((int3)(local_6c >> 8),(byte)local_6c | pTVar8->isGeneric);
      ExpressionContext::PopScope(pEVar5,SCOPE_TEMPORARY,true);
    }
    else {
      pTVar8 = local_58->type;
      local_58 = local_58->next;
    }
    bVar1 = (bool)(source->super_SynBase).field_0x3a;
    pSVar3 = source->name;
    if (argData->count == argData->max) {
      SmallArray<ArgumentData,_8U>::grow(argData,argData->count);
    }
    pAVar4 = argData->data;
    if (pAVar4 == (ArgumentData *)0x0) {
      __assert_fail("data",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x162,
                    "void SmallArray<ArgumentData, 8>::push_back(const T &) [T = ArgumentData, N = 8]"
                   );
    }
    uVar2 = argData->count;
    argData->count = uVar2 + 1;
    pAVar4[uVar2].source = &source->super_SynBase;
    pAVar4[uVar2].isExplicit = bVar1;
    pAVar4[uVar2].name = pSVar3;
    pAVar4[uVar2].type = pTVar8;
    pAVar4[uVar2].value = pEVar7;
    pAVar4[uVar2].valueFunction = (FunctionData *)0x0;
    source = (SynFunctionArgument *)(source->super_SynBase).next;
    ctx = local_50;
    instance = local_48;
    if ((source == (SynFunctionArgument *)0x0) || ((source->super_SynBase).typeID != 0x36)) {
      source = (SynFunctionArgument *)0x0;
    }
  } while( true );
}

Assistant:

void AnalyzeFunctionDefinitionArguments(ExpressionContext &ctx, IntrusiveList<SynFunctionArgument> arguments, TypeBase *parentType, TypeFunction *instance, SmallArray<ArgumentData, 8> &argData)
{
	TypeHandle *instanceArg = instance ? instance->arguments.head : NULL;

	bool hadGenericArgument = parentType ? parentType->isGeneric : false;

	for(SynFunctionArgument *argument = arguments.head; argument; argument = getType<SynFunctionArgument>(argument->next))
	{
		ExprBase *initializer = argument->initializer ? AnalyzeExpression(ctx, argument->initializer) : NULL;

		TypeBase *type = NULL;

		if(instance)
		{
			type = instanceArg->type;

			instanceArg = instanceArg->next;
		}
		else
		{
			// Create temporary scope with known arguments for reference in type expression
			ctx.PushTemporaryScope();

			unsigned pos = 0;

			for(SynFunctionArgument *prevArg = arguments.head; prevArg && prevArg != argument; prevArg = getType<SynFunctionArgument>(prevArg->next))
			{
				ArgumentData &data = argData[pos++];

				ctx.AddVariable(new (ctx.get<VariableData>()) VariableData(ctx.allocator, prevArg, ctx.scope, 0, data.type, data.name, 0, ctx.uniqueVariableId++), true);
			}

			bool failed = false;
			type = AnalyzeType(ctx, argument->type, true, hadGenericArgument ? &failed : NULL);

			if(type == ctx.typeAuto)
			{
				if(!initializer)
					Stop(ctx, argument->type, "ERROR: function argument cannot be an auto type");

				initializer = ResolveInitializerValue(ctx, argument, initializer);

				type = initializer->type;
			}
			else if(initializer && !isType<TypeError>(initializer->type))
			{
				// Just a test
				if(!type->isGeneric && !isType<TypeError>(type))
					CreateCast(ctx, argument->type, initializer, type, true);
			}

			if(type == ctx.typeVoid)
				Stop(ctx, argument->type, "ERROR: function argument cannot be a void type");

			hadGenericArgument |= type->isGeneric;

			// Remove temporary scope
			ctx.PopScope(SCOPE_TEMPORARY);
		}

		argData.push_back(ArgumentData(argument, argument->isExplicit, argument->name, type, initializer));
	}
}